

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<unsigned_long,unsigned_long,duckdb::NotEquals,false,false>
                (unsigned_long *ldata,unsigned_long *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  ulong uVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  unsigned_long uVar5;
  sel_t *psVar6;
  idx_t iVar7;
  sel_t sVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  unsigned_long uVar14;
  ulong uVar15;
  bool bVar16;
  
  uVar1 = count + 0x3f;
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (uVar1 < 0x40) {
        lVar10 = 0;
      }
      else {
        puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        lVar10 = 0;
        uVar11 = 0;
        uVar15 = 0;
        do {
          if (puVar2 == (unsigned_long *)0x0) {
            uVar14 = 0xffffffffffffffff;
          }
          else {
            uVar14 = puVar2[uVar11];
          }
          uVar9 = uVar15 + 0x40;
          if (count <= uVar15 + 0x40) {
            uVar9 = count;
          }
          uVar12 = uVar15;
          if (uVar14 == 0xffffffffffffffff) {
            if (uVar15 < uVar9) {
              psVar3 = sel->sel_vector;
              psVar4 = false_sel->sel_vector;
              do {
                uVar12 = uVar15;
                if (psVar3 != (sel_t *)0x0) {
                  uVar12 = (ulong)psVar3[uVar15];
                }
                uVar14 = ldata[uVar15];
                uVar5 = rdata[uVar15];
                psVar4[lVar10] = (sel_t)uVar12;
                lVar10 = lVar10 + (ulong)(uVar14 == uVar5);
                uVar15 = uVar15 + 1;
                uVar12 = uVar15;
              } while (uVar9 != uVar15);
            }
          }
          else if (uVar14 == 0) {
            uVar12 = uVar9;
            if (uVar15 < uVar9) {
              psVar3 = sel->sel_vector;
              psVar4 = false_sel->sel_vector;
              do {
                sVar8 = (sel_t)uVar15;
                if (psVar3 != (sel_t *)0x0) {
                  sVar8 = psVar3[uVar15];
                }
                psVar4[lVar10] = sVar8;
                lVar10 = lVar10 + 1;
                uVar15 = uVar15 + 1;
              } while (uVar9 != uVar15);
            }
          }
          else if (uVar15 < uVar9) {
            psVar3 = sel->sel_vector;
            psVar4 = false_sel->sel_vector;
            uVar12 = 0;
            do {
              if (psVar3 == (sel_t *)0x0) {
                sVar8 = (int)uVar15 + (int)uVar12;
              }
              else {
                sVar8 = psVar3[uVar15 + uVar12];
              }
              if ((uVar14 >> (uVar12 & 0x3f) & 1) == 0) {
                uVar13 = 1;
              }
              else {
                uVar13 = (ulong)(ldata[uVar15 + uVar12] == rdata[uVar15 + uVar12]);
              }
              psVar4[lVar10] = sVar8;
              lVar10 = lVar10 + uVar13;
              uVar12 = uVar12 + 1;
            } while ((uVar15 - uVar9) + uVar12 != 0);
            uVar12 = uVar15 + uVar12;
          }
          uVar11 = uVar11 + 1;
          uVar15 = uVar12;
        } while (uVar11 != uVar1 >> 6);
      }
      return count - lVar10;
    }
    if (0x3f < uVar1) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar7 = 0;
      uVar11 = 0;
      uVar15 = 0;
      do {
        if (puVar2 == (unsigned_long *)0x0) {
          uVar14 = 0xffffffffffffffff;
        }
        else {
          uVar14 = puVar2[uVar11];
        }
        uVar9 = uVar15 + 0x40;
        if (count <= uVar15 + 0x40) {
          uVar9 = count;
        }
        uVar12 = uVar9;
        if (uVar14 != 0) {
          uVar12 = uVar15;
          if (uVar14 == 0xffffffffffffffff) {
            if (uVar15 < uVar9) {
              psVar3 = sel->sel_vector;
              psVar4 = true_sel->sel_vector;
              do {
                uVar15 = uVar12;
                if (psVar3 != (sel_t *)0x0) {
                  uVar15 = (ulong)psVar3[uVar12];
                }
                uVar14 = ldata[uVar12];
                uVar5 = rdata[uVar12];
                psVar4[iVar7] = (sel_t)uVar15;
                iVar7 = iVar7 + (uVar14 != uVar5);
                uVar12 = uVar12 + 1;
              } while (uVar9 != uVar12);
            }
          }
          else if (uVar15 < uVar9) {
            psVar3 = sel->sel_vector;
            psVar4 = true_sel->sel_vector;
            uVar12 = 0;
            do {
              if (psVar3 == (sel_t *)0x0) {
                sVar8 = (int)uVar15 + (int)uVar12;
              }
              else {
                sVar8 = psVar3[uVar15 + uVar12];
              }
              if ((uVar14 >> (uVar12 & 0x3f) & 1) == 0) {
                uVar13 = 0;
              }
              else {
                uVar13 = (ulong)(ldata[uVar15 + uVar12] != rdata[uVar15 + uVar12]);
              }
              psVar4[iVar7] = sVar8;
              iVar7 = iVar7 + uVar13;
              uVar12 = uVar12 + 1;
            } while ((uVar15 - uVar9) + uVar12 != 0);
            uVar12 = uVar15 + uVar12;
          }
        }
        uVar11 = uVar11 + 1;
        uVar15 = uVar12;
      } while (uVar11 != uVar1 >> 6);
      return iVar7;
    }
  }
  else if (0x3f < uVar1) {
    puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar7 = 0;
    lVar10 = 0;
    uVar11 = 0;
    uVar15 = 0;
    do {
      if (puVar2 == (unsigned_long *)0x0) {
        uVar14 = 0xffffffffffffffff;
      }
      else {
        uVar14 = puVar2[uVar11];
      }
      uVar9 = uVar15 + 0x40;
      if (count <= uVar15 + 0x40) {
        uVar9 = count;
      }
      uVar12 = uVar15;
      if (uVar14 == 0xffffffffffffffff) {
        if (uVar15 < uVar9) {
          psVar3 = sel->sel_vector;
          psVar4 = true_sel->sel_vector;
          psVar6 = false_sel->sel_vector;
          do {
            uVar12 = uVar15;
            if (psVar3 != (sel_t *)0x0) {
              uVar12 = (ulong)psVar3[uVar15];
            }
            uVar14 = ldata[uVar15];
            uVar5 = rdata[uVar15];
            psVar4[iVar7] = (sel_t)uVar12;
            iVar7 = iVar7 + (uVar14 != uVar5);
            psVar6[lVar10] = (sel_t)uVar12;
            lVar10 = lVar10 + (ulong)(uVar14 == uVar5);
            uVar15 = uVar15 + 1;
            uVar12 = uVar15;
          } while (uVar9 != uVar15);
        }
      }
      else if (uVar14 == 0) {
        uVar12 = uVar9;
        if (uVar15 < uVar9) {
          psVar3 = sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          do {
            uVar13 = uVar15;
            if (psVar3 != (sel_t *)0x0) {
              uVar13 = (ulong)psVar3[uVar15];
            }
            psVar4[lVar10] = (sel_t)uVar13;
            lVar10 = lVar10 + 1;
            uVar15 = uVar15 + 1;
          } while (uVar9 != uVar15);
        }
      }
      else if (uVar15 < uVar9) {
        psVar3 = sel->sel_vector;
        psVar4 = true_sel->sel_vector;
        psVar6 = false_sel->sel_vector;
        uVar12 = 0;
        do {
          if (psVar3 == (sel_t *)0x0) {
            sVar8 = (int)uVar15 + (int)uVar12;
          }
          else {
            sVar8 = psVar3[uVar15 + uVar12];
          }
          if ((uVar14 >> (uVar12 & 0x3f) & 1) == 0) {
            bVar16 = false;
          }
          else {
            bVar16 = ldata[uVar15 + uVar12] != rdata[uVar15 + uVar12];
          }
          psVar4[iVar7] = sVar8;
          iVar7 = iVar7 + bVar16;
          psVar6[lVar10] = sVar8;
          lVar10 = lVar10 + (ulong)(bVar16 ^ 1);
          uVar12 = uVar12 + 1;
        } while ((uVar15 - uVar9) + uVar12 != 0);
        uVar12 = uVar15 + uVar12;
      }
      uVar11 = uVar11 + 1;
      uVar15 = uVar12;
    } while (uVar11 != uVar1 >> 6);
    return iVar7;
  }
  return 0;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}